

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O3

Type_error *
attr_wrapper::genTypeError(Type_error *__return_storage_ptr__,string *name,string *type)

{
  pointer pcVar1;
  string toReturn;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + name->_M_string_length);
  std::operator+(&local_38," is not a",type);
  std::__cxx11::string::_M_append((char *)local_58,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::runtime_error::runtime_error(&__return_storage_ptr__->super_runtime_error,(string *)local_58)
  ;
  *(undefined ***)__return_storage_ptr__ = &PTR__runtime_error_001390e8;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Type_error genTypeError(const std::string& name,
                                  const std::string& type)
   {
      std::string toReturn = name;
      toReturn += " is not a" + type;
      return Type_error(toReturn);
   }